

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixin_inheritance.cpp
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Color *c)

{
  Color CVar1;
  char *pcVar2;
  char *pcVar3;
  
  CVar1 = *c;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (CVar1 == Blue) {
    pcVar3 = "blue";
    pcVar2 = "";
  }
  else if (CVar1 == Green) {
    pcVar3 = "green";
    pcVar2 = "";
  }
  else if (CVar1 == Red) {
    pcVar3 = "red";
    pcVar2 = "";
  }
  else {
    pcVar3 = "none";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Color& c)
{
	switch(c)
	{
	case Color::Red:
		return "red";
	case Color::Blue:
		return "blue";
	case Color::Green:
		return "green";
	default:
		return "none";
	}
}